

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_setbyhandle(HSQUIRRELVM v,SQInteger idx,HSQMEMBERHANDLE *handle)

{
  SQObjectPtr *self;
  SQObjectPtr *obj;
  SQRESULT SVar1;
  SQRESULT SVar2;
  SQObjectPtr *val;
  
  self = stack_get(v,idx);
  SVar2 = -1;
  obj = SQVM::GetUp(v,-1);
  val = (SQObjectPtr *)0x0;
  SVar1 = _getmemberbyhandle(v,self,handle,&val);
  if (-1 < SVar1) {
    SQObjectPtr::operator=(val,obj);
    SQVM::Pop(v);
    SVar2 = 0;
  }
  return SVar2;
}

Assistant:

SQRESULT sq_setbyhandle(HSQUIRRELVM v,SQInteger idx,const HSQMEMBERHANDLE *handle)
{
    SQObjectPtr &self = stack_get(v,idx);
    SQObjectPtr &newval = stack_get(v,-1);
    SQObjectPtr *val = NULL;
    if(SQ_FAILED(_getmemberbyhandle(v,self,handle,val))) {
        return SQ_ERROR;
    }
    *val = newval;
    v->Pop();
    return SQ_OK;
}